

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# audioio.cpp
# Opt level: O2

int GetAudioLength(char *filename)

{
  int iVar1;
  uint uVar2;
  FILE *__stream;
  size_t sVar3;
  int i;
  uint uVar4;
  undefined4 local_40;
  undefined1 local_3c;
  uchar for_int_number [4];
  
  __stream = fopen(filename,"rb");
  if (__stream == (FILE *)0x0) {
    iVar1 = 0;
  }
  else {
    iVar1 = anon_unknown.dwarf_ae93::CheckHeader((FILE *)__stream);
    if (iVar1 != 0) {
      local_3c = 0;
      local_40 = 0;
      fseek(__stream,10,1);
      fread(for_int_number,1,2,__stream);
      while (sVar3 = fread(&local_40,1,1,__stream), sVar3 != 0) {
        if ((char)local_40 == 'd') {
          fread((void *)((long)&local_40 + 1),1,3,__stream);
          iVar1 = bcmp(&local_40,"data",5);
          if (iVar1 == 0) break;
          fseek(__stream,-3,1);
        }
      }
      iVar1 = bcmp(&local_40,"data",5);
      if (iVar1 == 0) {
        fread(for_int_number,1,4,__stream);
        fclose(__stream);
        uVar2 = 0;
        for (uVar4 = 3; -1 < (int)uVar4; uVar4 = uVar4 - 1) {
          uVar2 = uVar2 << 8 | (uint)for_int_number[uVar4];
        }
        return (int)uVar2 / (int)(uint)(for_int_number[0] >> 3);
      }
    }
    fclose(__stream);
    iVar1 = -1;
  }
  return iVar1;
}

Assistant:

int GetAudioLength(const char *filename) {
  FILE *fp = fopen(filename, "rb");
  if (NULL == fp) {
    return 0;
  }

  if (0 == CheckHeader(fp)) {
    fclose(fp);
    return -1;
  }

  char data_check[5] = { 0 };
  data_check[4] = '\0';
  unsigned char for_int_number[4];

  // Quantization
  fseek(fp, 10, SEEK_CUR);
  fread(for_int_number, 1, 2, fp);
  int nbit = for_int_number[0];

  while (0 != fread(data_check, 1, 1, fp)) {
    if ('d' == data_check[0]) {
      fread(&data_check[1], 1, 3, fp);
      if (0 != strcmp(data_check, "data"))
        fseek(fp, -3, SEEK_CUR);
      else
        break;
    }
  }
  if (0 != strcmp(data_check, "data")) {
    fclose(fp);
    return -1;
  }

  fread(for_int_number, 1, 4, fp);  // "data"
  fclose(fp);

  int wav_length = 0;
  for (int i = 3; i >= 0; --i)
    wav_length = wav_length * 256 + for_int_number[i];
  wav_length /= (nbit / 8);

  return wav_length;
}